

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3TruncateNode(char *aNode,int nNode,Blob *pNew,char *zTerm,int nTerm,sqlite3_int64 *piBlock)

{
  char cVar1;
  sqlite3_int64 sVar2;
  char *zTerm_00;
  int nTerm_00;
  int iVar3;
  Blob prev;
  NodeReader reader;
  int local_7c;
  Blob local_78;
  NodeReader local_68;
  
  local_78.a = (char *)0x0;
  local_78.n = 0;
  local_78.nAlloc = 0;
  local_7c = 0;
  cVar1 = *aNode;
  blobGrowBuffer(pNew,nNode,&local_7c);
  iVar3 = local_7c;
  if (local_7c == 0) {
    pNew->n = 0;
    iVar3 = nodeReaderInit(&local_68,aNode,nNode);
    while ((nTerm_00 = local_68.term.n, zTerm_00 = local_68.term.a, iVar3 == 0 &&
           (local_68.aNode != (char *)0x0))) {
      if (pNew->n == 0) {
        iVar3 = fts3TermCmp(local_68.term.a,local_68.term.n,zTerm,nTerm);
        sVar2 = local_68.iChild;
        if ((-1 < iVar3) && (cVar1 == '\0' || iVar3 != 0)) {
          fts3StartNode(pNew,(int)*aNode,local_68.iChild);
          *piBlock = sVar2;
          goto LAB_001ac562;
        }
      }
      else {
LAB_001ac562:
        iVar3 = fts3AppendToNode(pNew,&local_78,zTerm_00,nTerm_00,local_68.aDoclist,
                                 local_68.nDoclist);
        if (iVar3 != 0) break;
      }
      iVar3 = nodeReaderNext(&local_68);
    }
    if (pNew->n == 0) {
      fts3StartNode(pNew,(int)*aNode,local_68.iChild);
      *piBlock = local_68.iChild;
    }
    sqlite3_free(local_68.term.a);
    sqlite3_free(local_78.a);
  }
  return iVar3;
}

Assistant:

static int fts3TruncateNode(
  const char *aNode,              /* Current node image */
  int nNode,                      /* Size of aNode in bytes */
  Blob *pNew,                     /* OUT: Write new node image here */
  const char *zTerm,              /* Omit all terms smaller than this */
  int nTerm,                      /* Size of zTerm in bytes */
  sqlite3_int64 *piBlock          /* OUT: Block number in next layer down */
){
  NodeReader reader;              /* Reader object */
  Blob prev = {0, 0, 0};          /* Previous term written to new node */
  int rc = SQLITE_OK;             /* Return code */
  int bLeaf = aNode[0]=='\0';     /* True for a leaf node */

  /* Allocate required output space */
  blobGrowBuffer(pNew, nNode, &rc);
  if( rc!=SQLITE_OK ) return rc;
  pNew->n = 0;

  /* Populate new node buffer */
  for(rc = nodeReaderInit(&reader, aNode, nNode); 
      rc==SQLITE_OK && reader.aNode; 
      rc = nodeReaderNext(&reader)
  ){
    if( pNew->n==0 ){
      int res = fts3TermCmp(reader.term.a, reader.term.n, zTerm, nTerm);
      if( res<0 || (bLeaf==0 && res==0) ) continue;
      fts3StartNode(pNew, (int)aNode[0], reader.iChild);
      *piBlock = reader.iChild;
    }
    rc = fts3AppendToNode(
        pNew, &prev, reader.term.a, reader.term.n,
        reader.aDoclist, reader.nDoclist
    );
    if( rc!=SQLITE_OK ) break;
  }
  if( pNew->n==0 ){
    fts3StartNode(pNew, (int)aNode[0], reader.iChild);
    *piBlock = reader.iChild;
  }
  assert( pNew->n<=pNew->nAlloc );

  nodeReaderRelease(&reader);
  sqlite3_free(prev.a);
  return rc;
}